

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::iterateMulti(HEkkDual *this)

{
  HVector *row_ep;
  
  this->slice_PRICE = 1;
  majorChooseRow(this);
  minorChooseRow(this);
  if (this->row_out == -1) {
    this->rebuild_reason = 3;
    return;
  }
  row_ep = this->multi_finish[this->multi_nFinish].row_ep;
  if ((double)row_ep->count / (double)this->solver_num_row < 0.01) {
    this->slice_PRICE = 0;
  }
  if (this->slice_PRICE == 0) {
    chooseColumn(this,row_ep);
  }
  else {
    chooseColumnSlice(this,row_ep);
  }
  if (this->rebuild_reason == 0) {
    minorUpdate(this);
  }
  else if (this->multi_nFinish == 0) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                "PAMI skipping majorUpdate() due to multi_nFinish = %d; rebuild_reason = %d\n",0);
    return;
  }
  majorUpdate(this);
  return;
}

Assistant:

void HEkkDual::iterateMulti() {
  slice_PRICE = 1;

  // Report candidate
  majorChooseRow();
  minorChooseRow();
  if (row_out == kNoRowChosen) {
    rebuild_reason = kRebuildReasonPossiblyOptimal;
    return;
  }

  // Assign the slice_row_ep, skip if possible
  if (1.0 * multi_finish[multi_nFinish].row_ep->count / solver_num_row < 0.01)
    slice_PRICE = 0;

  if (slice_PRICE) {
    // #pragma omp parallel
    // #pragma omp single
    chooseColumnSlice(multi_finish[multi_nFinish].row_ep);
  } else {
    chooseColumn(multi_finish[multi_nFinish].row_ep);
  }
  // If we failed.
  if (rebuild_reason) {
    if (multi_nFinish) {
      majorUpdate();
    } else {
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kWarning,
          "PAMI skipping majorUpdate() due to multi_nFinish = %" HIGHSINT_FORMAT
          "; "
          "rebuild_reason = %" HIGHSINT_FORMAT "\n",
          multi_nFinish, rebuild_reason);
    }
    return;
  }

  minorUpdate();
  majorUpdate();
}